

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O3

void ast::Sections::listing(ostream *lst_file)

{
  undefined8 *puVar1;
  ulong uVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(lst_file,"Sections\n",9);
  ostream_printf(lst_file,"%-8s%-16s%-10s%s\n","Index","Name","Address","Size");
  if (DAT_0013da98 != table) {
    uVar2 = 0;
    do {
      puVar1 = *(undefined8 **)(table + uVar2 * 8);
      ostream_printf(lst_file,"%-8d%-16s%04X      %04X %d\n",uVar2,*puVar1,
                     (ulong)*(uint *)((long)puVar1 + 0x24),(ulong)*(uint *)(puVar1 + 6),
                     *(uint *)(puVar1 + 6));
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)(DAT_0013da98 - table >> 3));
  }
  return;
}

Assistant:

void Sections::listing(std::ostream& lst_file)
{
	lst_file << "Sections\n";
	ostream_printf(lst_file, "%-8s%-16s%-10s%s\n", "Index", "Name", "Address", "Size");
	for (size_t i = 0; i < table.size(); ++i) {
		ostream_printf(lst_file, "%-8d%-16s%04X      %04X %d\n", i,
				table[i]->name.c_str(), table[i]->base_address,
				table[i]->content_size, table[i]->content_size);
	}
}